

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

ExtPubkey * __thiscall
cfd::core::KeyData::GetExtPubkey(ExtPubkey *__return_storage_ptr__,KeyData *this)

{
  ExtPubkey *in_stack_00000008;
  ExtPubkey *in_stack_00000010;
  KeyData *this_local;
  
  ExtPubkey::ExtPubkey(in_stack_00000010,in_stack_00000008);
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey KeyData::GetExtPubkey() const { return extpubkey_; }